

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,table_type *t,
          table_format_info *fmt,comment_type *com,source_location *loc)

{
  basic_value<toml::type_config> *this_00;
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  table_format_info *ptVar4;
  array_type *paVar5;
  serialization_error *psVar6;
  char (*s) [3];
  pointer this_01;
  __node_base *p_Var7;
  allocator<char> local_5b9;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> k;
  string_type local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  source_location local_3f0;
  source_location local_378;
  source_location local_300;
  source_location local_288;
  source_location local_210;
  source_location local_198;
  source_location local_120;
  source_location local_a8;
  
  if (this->force_inline_ == true) {
    if (fmt->fmt == multiline_oneline) {
switchD_00302a63_caseD_3:
      format_ml_inline_table(__return_storage_ptr__,this,t,fmt);
      return __return_storage_ptr__;
    }
switchD_00302a63_caseD_1:
    format_inline_table(__return_storage_ptr__,this,t,fmt);
  }
  else {
    switch(fmt->fmt) {
    case multiline:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      format_keys(&k,this,&this->keys_);
      if (k.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        this->current_indent_ = this->current_indent_ + fmt->name_indent;
        format_comments_abi_cxx11_(&local_590,this,com,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_590);
        std::__cxx11::string::~string((string *)&local_590);
        format_indent_abi_cxx11_(&local_590,this,fmt->indent_type);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_590);
        std::__cxx11::string::~string((string *)&local_590);
        this->current_indent_ = this->current_indent_ - fmt->name_indent;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,'[');
        if (k.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == false) {
          std::__throw_bad_optional_access();
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&k);
        string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
        ::invoke<3ul>(&local_590,
                      (string_conv_impl<char,std::char_traits<char>,std::allocator<char>,char,std::char_traits<char>,std::allocator<char>>
                       *)0x3557a0,s);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_590);
        std::__cxx11::string::~string((string *)&local_590);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&k);
      format_ml_table((string_type *)&k,this,t,fmt);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&k);
      std::__cxx11::string::~string((string *)&k);
      break;
    case oneline:
      goto switchD_00302a63_caseD_1;
    case dotted:
      k.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._16_8_ = 0;
      k.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
      k.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length = 0;
      pbVar1 = (this->keys_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((this->keys_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == pbVar1) {
        psVar6 = (serialization_error *)__cxa_allocate_exception(0xa0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,
                   "toml::serializer: dotted table must have its key. use format(key, v)",
                   (allocator<char> *)&local_590);
        source_location::source_location(&local_a8,loc);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"here",&local_5b9);
        format_error<>(&local_410,&local_430,&local_a8,&local_450);
        source_location::source_location(&local_120,loc);
        serialization_error::serialization_error(psVar6,&local_410,&local_120);
        __cxa_throw(psVar6,&serialization_error::typeinfo,serialization_error::~serialization_error)
        ;
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&k,pbVar1 + -1);
      format_dotted_table(__return_storage_ptr__,this,t,fmt,loc,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&k);
      k.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length =
           k.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_payload._M_value._M_string_length - 0x20;
      std::__cxx11::string::~string
                ((string *)
                 k.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_string_length);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&k);
      break;
    case multiline_oneline:
      goto switchD_00302a63_caseD_3;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      p_Var7 = &(t->_M_h)._M_before_begin;
      while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
        this_00 = (basic_value<toml::type_config> *)(p_Var7 + 5);
        if (*(char *)&p_Var7[5]._M_nxt == '\n') {
LAB_00302c9d:
          ptVar4 = basic_value<toml::type_config>::as_table_fmt(this_00);
          if ((ptVar4->fmt != multiline) &&
             (ptVar4 = basic_value<toml::type_config>::as_table_fmt(this_00),
             ptVar4->fmt != implicit)) {
            psVar6 = (serialization_error *)__cxa_allocate_exception(0xa0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f0,
                       "toml::serializer: an implicit table cannot have non-multiline table",
                       (allocator<char> *)&k);
            source_location::source_location(&local_288,(region *)(p_Var7 + 0xe));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_510,"here",(allocator<char> *)&local_590);
            format_error<>(&local_4d0,&local_4f0,&local_288,&local_510);
            source_location::source_location(&local_300,(region *)(p_Var7 + 0xe));
            serialization_error::serialization_error(psVar6,&local_4d0,&local_300);
            __cxa_throw(psVar6,&serialization_error::typeinfo,
                        serialization_error::~serialization_error);
          }
        }
        else {
          bVar3 = basic_value<toml::type_config>::is_array_of_tables(this_00);
          if (!bVar3) {
            psVar6 = (serialization_error *)__cxa_allocate_exception(0xa0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_490,
                       "toml::serializer: an implicit table cannot have non-table value.",
                       (allocator<char> *)&k);
            source_location::source_location(&local_198,(region *)(p_Var7 + 0xe));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4b0,"here",(allocator<char> *)&local_590);
            format_error<>(&local_470,&local_490,&local_198,&local_4b0);
            source_location::source_location(&local_210,(region *)(p_Var7 + 0xe));
            serialization_error::serialization_error(psVar6,&local_470,&local_210);
            __cxa_throw(psVar6,&serialization_error::typeinfo,
                        serialization_error::~serialization_error);
          }
          if (this_00->type_ == table) goto LAB_00302c9d;
          paVar5 = basic_value<toml::type_config>::as_array(this_00);
          pbVar2 = (paVar5->
                   super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (this_01 = (paVar5->
                         super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; this_01 != pbVar2;
              this_01 = this_01 + 1) {
            ptVar4 = basic_value<toml::type_config>::as_table_fmt(this_01);
            if ((ptVar4->fmt != multiline) &&
               (ptVar4 = basic_value<toml::type_config>::as_table_fmt(this_00),
               ptVar4->fmt != implicit)) {
              psVar6 = (serialization_error *)__cxa_allocate_exception(0xa0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_550,
                         "toml::serializer: an implicit table cannot have non-multiline table",
                         (allocator<char> *)&k);
              source_location::source_location(&local_378,&this_01->region_);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_570,"here",(allocator<char> *)&local_590);
              format_error<>(&local_530,&local_550,&local_378,&local_570);
              source_location::source_location(&local_3f0,&this_01->region_);
              serialization_error::serialization_error(psVar6,&local_530,&local_3f0);
              __cxa_throw(psVar6,&serialization_error::typeinfo,
                          serialization_error::~serialization_error);
            }
          }
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&this->keys_,(value_type *)(p_Var7 + 1));
        operator()[abi_cxx11_((string_type *)&k,this,this_00);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&k);
        std::__cxx11::string::~string((string *)&k);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->keys_);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const table_type& t, const table_format_info& fmt, const comment_type& com, const source_location& loc) // {{{
    {
        if(this->force_inline_)
        {
            if(fmt.fmt == table_format::multiline_oneline)
            {
                return this->format_ml_inline_table(t, fmt);
            }
            else
            {
                return this->format_inline_table(t, fmt);
            }
        }
        else
        {
            if(fmt.fmt == table_format::multiline)
            {
                string_type retval;
                // comment is emitted inside format_ml_table
                if(auto k = this->format_keys(this->keys_))
                {
                    this->current_indent_ += fmt.name_indent;
                    retval += this->format_comments(com, fmt.indent_type);
                    retval += this->format_indent(fmt.indent_type);
                    this->current_indent_ -= fmt.name_indent;
                    retval += char_type('[');
                    retval += k.value();
                    retval += string_conv<string_type>("]\n");
                }
                // otherwise, its the root.

                retval += this->format_ml_table(t, fmt);
                return retval;
            }
            else if(fmt.fmt == table_format::oneline)
            {
                return this->format_inline_table(t, fmt);
            }
            else if(fmt.fmt == table_format::multiline_oneline)
            {
                return this->format_ml_inline_table(t, fmt);
            }
            else if(fmt.fmt == table_format::dotted)
            {
                std::vector<string_type> keys;
                if(this->keys_.empty())
                {
                    throw serialization_error(format_error("toml::serializer: "
                        "dotted table must have its key. use format(key, v)",
                        loc, "here"), loc);
                }
                keys.push_back(this->keys_.back());

                const auto retval = this->format_dotted_table(t, fmt, loc, keys);
                keys.pop_back();
                return retval;
            }
            else
            {
                assert(fmt.fmt == table_format::implicit);

                string_type retval;
                for(const auto& kv : t)
                {
                    const auto& k = kv.first;
                    const auto& v = kv.second;

                    if( ! v.is_table() && ! v.is_array_of_tables())
                    {
                        throw serialization_error(format_error("toml::serializer: "
                            "an implicit table cannot have non-table value.",
                            v.location(), "here"), v.location());
                    }
                    if(v.is_table())
                    {
                        if(v.as_table_fmt().fmt != table_format::multiline &&
                           v.as_table_fmt().fmt != table_format::implicit)
                        {
                            throw serialization_error(format_error("toml::serializer: "
                                "an implicit table cannot have non-multiline table",
                                v.location(), "here"), v.location());
                        }
                    }
                    else
                    {
                        assert(v.is_array());
                        for(const auto& e : v.as_array())
                        {
                            if(e.as_table_fmt().fmt != table_format::multiline &&
                               v.as_table_fmt().fmt != table_format::implicit)
                            {
                                throw serialization_error(format_error("toml::serializer: "
                                    "an implicit table cannot have non-multiline table",
                                    e.location(), "here"), e.location());
                            }
                        }
                    }

                    keys_.push_back(k);
                    retval += (*this)(v);
                    keys_.pop_back();
                }
                return retval;
            }
        }
    }